

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::anon_unknown_34::BrokenClient::whenMoreResolved(BrokenClient *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aVar1;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar2;
  Exception local_1b8;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_28 [3];
  BrokenClient *this_local;
  
  this_local = this;
  if ((*(byte *)(in_RSI + 0x1b0) & 1) == 0) {
    kj::cp<kj::Exception>(&local_1b8,(Exception *)(in_RSI + 0x20));
    kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Promise(local_28,&local_1b8);
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::Maybe
              ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)this,local_28);
    kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Promise(local_28);
    kj::Exception::~Exception(&local_1b8);
    aVar1 = extraout_RDX_00;
  }
  else {
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::Maybe
              ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)this);
    aVar1 = extraout_RDX;
  }
  MVar2.ptr.field_1 = aVar1;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    if (resolved) {
      return kj::none;
    } else {
      return kj::Promise<kj::Own<ClientHook>>(kj::cp(exception));
    }
  }